

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O2

bool __thiscall hwnet::Epoll::Init(Epoll *this)

{
  int iVar1;
  epoll_event *peVar2;
  bool bVar3;
  
  iVar1 = epoll_create1(0x80000);
  this->epfd = iVar1;
  if (iVar1 < 0) {
    bVar3 = false;
  }
  else {
    this->maxevents = 0x40;
    peVar2 = (epoll_event *)calloc(1,0x300);
    this->events = peVar2;
    bVar3 = peVar2 != (epoll_event *)0x0;
  }
  return bVar3;
}

Assistant:

bool Epoll::Init() {

	epfd  = epoll_create1(EPOLL_CLOEXEC);
	if(epfd < 0) {
		return false;
	}

	maxevents = 64;
	events = (epoll_event*)calloc(1,(sizeof(*this->events)*this->maxevents));
	if(!events) {
		return false;
	}	

	return true;
}